

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O0

void R_InitColormaps(void)

{
  int iVar1;
  BYTE *__src;
  BYTE BVar2;
  int iVar3;
  uint uVar4;
  FakeCmap *pFVar5;
  BYTE *__dest;
  int b_1;
  int g_1;
  int r_1;
  int intensity;
  int c;
  BYTE *shade;
  int m;
  uint i_2;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_3a8 [4];
  BYTE *local_398;
  BYTE *map2;
  BYTE *map;
  FWadLump lump;
  int b;
  int g;
  int r;
  int k;
  uint j;
  int i_1;
  BYTE mapin [256];
  BYTE remap [256];
  BYTE unremap [256];
  char local_29 [8];
  char name [9];
  DWORD i;
  DWORD NumLumps;
  FakeCmap cm;
  
  FakeCmap::FakeCmap((FakeCmap *)&i);
  R_DeinitColormaps();
  i._0_1_ = 0;
  PalEntry::operator=((PalEntry *)&cm,0);
  TArray<FakeCmap,_FakeCmap>::Push(&fakecmaps,(FakeCmap *)&i);
  name._5_4_ = FWadCollection::GetNumLumps(&Wads);
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  for (; (uint)name._1_4_ < (uint)name._5_4_; name._1_4_ = name._1_4_ + 1) {
    iVar3 = FWadCollection::GetLumpNamespace(&Wads,name._1_4_);
    if (iVar3 == 3) {
      name[0] = '\0';
      FWadCollection::GetLumpName(&Wads,local_29,name._1_4_);
      iVar3 = FWadCollection::CheckNumForName(&Wads,local_29,3);
      if (iVar3 == name._1_4_) {
        strncpy((char *)&i,local_29,8);
        PalEntry::operator=((PalEntry *)&cm,0);
        cm.name[4] = name[1];
        cm.name[5] = name[2];
        cm.name[6] = name[3];
        cm.name[7] = name[4];
        TArray<FakeCmap,_FakeCmap>::Push(&fakecmaps,(FakeCmap *)&i);
      }
    }
  }
  uVar4 = TArray<FakeCmap,_FakeCmap>::Size(&fakecmaps);
  realcolormaps = (BYTE *)operator_new__((ulong)(uVar4 << 0xd));
  R_SetDefaultColormap("COLORMAP");
  uVar4 = TArray<FakeCmap,_FakeCmap>::Size(&fakecmaps);
  if (1 < uVar4) {
    memcpy(mapin + 0xf8,GPalette.Remap,0x100);
    memset(remap + 0xf8,0,0x100);
    for (k = 0; k < 0x100; k = k + 1) {
      remap[(ulong)mapin[(long)k + 0xf8] + 0xf8] = (BYTE)k;
    }
    mapin[0xf8] = '\0';
    for (r = 1; uVar4 = TArray<FakeCmap,_FakeCmap>::Size(&fakecmaps), (uint)r < uVar4; r = r + 1) {
      pFVar5 = TArray<FakeCmap,_FakeCmap>::operator[](&fakecmaps,(ulong)(uint)r);
      iVar3 = FWadCollection::LumpLength(&Wads,pFVar5->lump);
      if (0x20ff < iVar3) {
        pFVar5 = TArray<FakeCmap,_FakeCmap>::operator[](&fakecmaps,(ulong)(uint)r);
        FWadCollection::OpenLumpNum((FWadLump *)&map,&Wads,pFVar5->lump);
        map2 = realcolormaps + (uint)(r << 0xd);
        for (g = 0; g < 0x20; g = g + 1) {
          local_398 = map2 + (g << 8);
          FWadLump::Read((FWadLump *)&map,&j,0x100);
          *local_398 = '\0';
          for (b = 1; b < 0x100; b = b + 1) {
            local_398[b] = mapin[(ulong)*(byte *)((long)&j + (ulong)remap[(long)b + 0xf8]) + 0xf8];
          }
        }
        lump.Lump._0_4_ = 0;
        lump.Lump._4_4_ = 0;
        b = 0;
        for (g = 0; g < 0x100; g = g + 1) {
          b = (uint)GPalette.BaseColors[map2[g]].field_0.field_0.r + b;
          lump.Lump._4_4_ = (uint)GPalette.BaseColors[map2[g]].field_0.field_0.g + lump.Lump._4_4_;
          lump.Lump._0_4_ = (uint)GPalette.BaseColors[map2[g]].field_0.field_0.b + (int)lump.Lump;
        }
        if (b < 0) {
          b = b + 0xff;
        }
        iVar3 = lump.Lump._4_4_;
        if (lump.Lump._4_4_ < 0) {
          iVar3 = lump.Lump._4_4_ + 0xff;
        }
        iVar1 = (int)lump.Lump;
        if ((int)lump.Lump < 0) {
          iVar1 = (int)lump.Lump + 0xff;
        }
        PalEntry::PalEntry((PalEntry *)&local_3a8[0].field_0,0xff,(BYTE)((uint)b >> 8),
                           (BYTE)((uint)iVar3 >> 8),(BYTE)((uint)iVar1 >> 8));
        pFVar5 = TArray<FakeCmap,_FakeCmap>::operator[](&fakecmaps,(ulong)(uint)r);
        (pFVar5->blend).field_0 = local_3a8[0];
        FWadLump::~FWadLump((FWadLump *)&map);
      }
    }
  }
  if (realfbcolormaps == (BYTE *)0x0) {
    uVar4 = TArray<FakeCmap,_FakeCmap>::Size(&fakecmaps);
    __dest = (BYTE *)operator_new__((ulong)(uVar4 << 0xd));
    __src = realcolormaps;
    realfbcolormaps = __dest;
    uVar4 = TArray<FakeCmap,_FakeCmap>::Size(&fakecmaps);
    memcpy(__dest,__src,(ulong)(uVar4 << 0xd));
  }
  PalEntry::PalEntry((PalEntry *)&i_2,0xff,0xff,0xff);
  NormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)i_2;
  PalEntry::operator=(&NormalLight.Fade,0);
  NormalLight.Maps = realcolormaps;
  PalEntry::PalEntry((PalEntry *)&m,0xff,0xff,0xff);
  FullNormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)m;
  PalEntry::operator=(&FullNormalLight.Fade,0);
  FullNormalLight.Maps = realfbcolormaps;
  NormalLightHasFixedLights = R_CheckForFixedLights(realcolormaps);
  uVar4 = TArray<FakeCmap,_FakeCmap>::Size(&fakecmaps);
  numfakecmaps = (size_t)uVar4;
  for (shade._4_4_ = 0; shade._4_4_ < 5; shade._4_4_ = shade._4_4_ + 1) {
    AddSpecialColormap(SpecialColormapParms[shade._4_4_].Start[0],
                       SpecialColormapParms[shade._4_4_].Start[1],
                       SpecialColormapParms[shade._4_4_].Start[2],
                       SpecialColormapParms[shade._4_4_].End[0],
                       SpecialColormapParms[shade._4_4_].End[1],
                       SpecialColormapParms[shade._4_4_].End[2]);
  }
  for (shade._0_4_ = 0; (int)shade < 0x1f; shade._0_4_ = (int)shade + 1) {
    for (r_1 = 0; r_1 < 0x100; r_1 = r_1 + 1) {
      uVar4 = ((uint)GPalette.BaseColors[r_1].field_0.field_0.r * 0x4d +
               (uint)GPalette.BaseColors[r_1].field_0.field_0.g * 0x8f +
              (uint)GPalette.BaseColors[r_1].field_0.field_0.b * 0x25) / 0x100;
      BVar2 = FColorMatcher::Pick(&ColorMatcher,
                                  (int)((uint)GPalette.BaseColors[r_1].field_0.field_0.r *
                                        (0x1f - (int)shade) + uVar4 * (int)shade) / 0x1f,
                                  (int)((uint)GPalette.BaseColors[r_1].field_0.field_0.g *
                                        (0x1f - (int)shade) + uVar4 * (int)shade) / 0x1f,
                                  (int)((uint)GPalette.BaseColors[r_1].field_0.field_0.b *
                                        (0x1f - (int)shade) + uVar4 * (int)shade) / 0x1f);
      DesaturateColormap[(int)shade][r_1] = BVar2;
    }
  }
  return;
}

Assistant:

void R_InitColormaps ()
{
	// [RH] Try and convert BOOM colormaps into blending values.
	//		This is a really rough hack, but it's better than
	//		not doing anything with them at all (right?)

	FakeCmap cm;

	R_DeinitColormaps();

	cm.name[0] = 0;
	cm.blend = 0;
	fakecmaps.Push(cm);

	DWORD NumLumps = Wads.GetNumLumps();

	for (DWORD i = 0; i < NumLumps; i++)
	{
		if (Wads.GetLumpNamespace(i) == ns_colormaps)
		{
			char name[9];
			name[8] = 0;
			Wads.GetLumpName (name, i);

			if (Wads.CheckNumForName (name, ns_colormaps) == (int)i)
			{
				strncpy(cm.name, name, 8);
				cm.blend = 0;
				cm.lump = i;
				fakecmaps.Push(cm);
			}
		}
	}
	realcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
	R_SetDefaultColormap ("COLORMAP");

	if (fakecmaps.Size() > 1)
	{
		BYTE unremap[256], remap[256], mapin[256];
		int i;
		unsigned j;

		memcpy (remap, GPalette.Remap, 256);
		memset (unremap, 0, 256);
		for (i = 0; i < 256; ++i)
		{
			unremap[remap[i]] = i;
		}
		remap[0] = 0;
		for (j = 1; j < fakecmaps.Size(); j++)
		{
			if (Wads.LumpLength (fakecmaps[j].lump) >= (NUMCOLORMAPS+1)*256)
			{
				int k, r, g, b;
				FWadLump lump = Wads.OpenLumpNum (fakecmaps[j].lump);
				BYTE *const map = realcolormaps + NUMCOLORMAPS*256*j;

				for (k = 0; k < NUMCOLORMAPS; ++k)
				{
					BYTE *map2 = &map[k*256];
					lump.Read (mapin, 256);
					map2[0] = 0;
					for (r = 1; r < 256; ++r)
					{
						map2[r] = remap[mapin[unremap[r]]];
					}
				}

				r = g = b = 0;

				for (k = 0; k < 256; k++)
				{
					r += GPalette.BaseColors[map[k]].r;
					g += GPalette.BaseColors[map[k]].g;
					b += GPalette.BaseColors[map[k]].b;
				}
				fakecmaps[j].blend = PalEntry (255, r/256, g/256, b/256);
			}
		}
	}

	// [SP] Create a copy of the colormap
	if (!realfbcolormaps)
	{
		realfbcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
		memcpy(realfbcolormaps, realcolormaps, 256*NUMCOLORMAPS*fakecmaps.Size());
	}

	NormalLight.Color = PalEntry (255, 255, 255);
	NormalLight.Fade = 0;
	NormalLight.Maps = realcolormaps;
	FullNormalLight.Color = PalEntry (255, 255, 255);
	FullNormalLight.Fade = 0;
	FullNormalLight.Maps = realfbcolormaps;
	NormalLightHasFixedLights = R_CheckForFixedLights(realcolormaps);
	numfakecmaps = fakecmaps.Size();

	// build default special maps (e.g. invulnerability)

	for (unsigned i = 0; i < countof(SpecialColormapParms); ++i)
	{
		AddSpecialColormap(SpecialColormapParms[i].Start[0], SpecialColormapParms[i].Start[1],
			SpecialColormapParms[i].Start[2], SpecialColormapParms[i].End[0],
			SpecialColormapParms[i].End[1], SpecialColormapParms[i].End[2]);
	}
	// desaturated colormaps. These are used for texture composition
	for(int m = 0; m < 31; m++)
	{
		BYTE *shade = DesaturateColormap[m];
		for (int c = 0; c < 256; c++)
		{
			int intensity = (GPalette.BaseColors[c].r * 77 +
						GPalette.BaseColors[c].g * 143 +
						GPalette.BaseColors[c].b * 37) / 256;

			int r = (GPalette.BaseColors[c].r * (31-m) + intensity *m) / 31;
			int g = (GPalette.BaseColors[c].g * (31-m) + intensity *m) / 31;
			int b = (GPalette.BaseColors[c].b * (31-m) + intensity *m) / 31;
			shade[c] = ColorMatcher.Pick(r, g, b);
		}
	}
}